

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::MultiVertexArrayCountTests::init
          (MultiVertexArrayCountTests *this,EVP_PKEY_CTX *ctx)

{
  GLValue min_;
  GLValue max_;
  long lVar1;
  int iVar2;
  bool bVar3;
  GLValue GVar4;
  GLValue GVar5;
  undefined4 uStack_d4;
  undefined4 uStack_c4;
  string desc;
  Spec spec;
  string name;
  
  for (lVar1 = 0; lVar1 != 7; lVar1 = lVar1 + 1) {
    spec.arrays.
    super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spec.arrays.
    super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    spec.arrays.
    super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spec.primitive = PRIMITIVE_TRIANGLES;
    spec.drawCount = 0x100;
    spec.first = 0;
    iVar2 = (&DAT_005bd4e0)[lVar1];
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      GVar4 = deqp::gls::GLValue::getMinValue(INPUTTYPE_FLOAT);
      GVar5 = deqp::gls::GLValue::getMaxValue(INPUTTYPE_FLOAT);
      max_._4_4_ = uStack_d4;
      max_.type = GVar5.type;
      min_._4_4_ = uStack_c4;
      min_.type = GVar4.type;
      min_.field_1 = GVar4.field_1;
      max_.field_1 = GVar5.field_1;
      deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                ((ArraySpec *)&name,INPUTTYPE_FLOAT,OUTPUTTYPE_VEC2,STORAGE_USER,USAGE_DYNAMIC_DRAW,
                 2,0,0,false,min_,max_);
      ctx = (EVP_PKEY_CTX *)&name;
      std::
      vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ::push_back(&spec.arrays,(value_type *)&name);
    }
    getTestName_abi_cxx11_(&name,(MultiVertexArrayCountTests *)ctx,&spec);
    getTestName_abi_cxx11_(&desc,(MultiVertexArrayCountTests *)ctx,&spec);
    ctx = (EVP_PKEY_CTX *)operator_new(0xe0);
    deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
              ((MultiVertexArrayTest *)ctx,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               ((this->super_TestCaseGroup).m_context)->m_renderCtx,&spec,name._M_dataplus._M_p,
               desc._M_dataplus._M_p);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)ctx);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&name);
    std::
    _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
    ::~_Vector_base(&spec.arrays.
                     super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                   );
  }
  return 7;
}

Assistant:

void MultiVertexArrayCountTests::init (void)
{
	// Test attribute counts
	int arrayCounts[] = {2, 3, 4, 5, 6, 7, 8};

	for (int arrayCountNdx = 0; arrayCountNdx < DE_LENGTH_OF_ARRAY(arrayCounts); arrayCountNdx++)
	{
		MultiVertexArrayTest::Spec spec;

		spec.primitive	= Array::PRIMITIVE_TRIANGLES;
		spec.drawCount	= 256;
		spec.first		= 0;

		for (int arrayNdx = 0; arrayNdx < arrayCounts[arrayCountNdx]; arrayNdx++)
		{
			MultiVertexArrayTest::Spec::ArraySpec arraySpec(Array::INPUTTYPE_FLOAT,
															Array::OUTPUTTYPE_VEC2,
															Array::STORAGE_USER,
															Array::USAGE_DYNAMIC_DRAW,
															2,
															0,
															0,
															false,
															GLValue::getMinValue(Array::INPUTTYPE_FLOAT),
															GLValue::getMaxValue(Array::INPUTTYPE_FLOAT));

			spec.arrays.push_back(arraySpec);
		}

		std::string name = getTestName(spec);
		std::string desc = getTestName(spec);

		addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), desc.c_str()));
	}
}